

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

int __thiscall ONX_Model::AddRenderEnvironment(ONX_Model *this,wchar_t *candidate_name)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  wchar_t *component_name;
  ON_ModelComponent *this_00;
  ON_wString env_name;
  ON_ModelComponentReference mcr;
  ON_RenderEnvironment env;
  uint in_stack_fffffffffffffd7c;
  ON_ComponentManifest local_278;
  undefined1 local_270 [16];
  ON_RenderContent local_260;
  
  bVar1 = ON_ModelComponent::IsValidComponentName(candidate_name);
  if (bVar1) {
    ON_RenderEnvironment::ON_RenderEnvironment((ON_RenderEnvironment *)(local_270 + 0x10));
    ON_RenderContent::SetTypeId
              ((ON_RenderContent *)(local_270 + 0x10),&ON_RenderContentType_BasicEnvironment);
    TVar2 = ON_ModelComponent::ComponentType((ON_ModelComponent *)(local_270 + 0x10));
    ON_ComponentManifest::UnusedName
              (&local_278,(char)this - 0x30,(ON_UUID)ZEXT116(TVar2),(wchar_t *)(uchar  [8])0x0,
               candidate_name,(wchar_t *)0x0,0,(uint *)((ulong)in_stack_fffffffffffffd7c << 0x20));
    component_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_278);
    ON_ModelComponent::SetName((ON_ModelComponent *)(local_270 + 0x10),component_name);
    AddModelComponent((ONX_Model *)local_270,(ON_ModelComponent *)this,
                      (bool)((char)local_270 + '\x10'));
    this_00 = ON_ModelComponentReference::ModelComponent((ON_ModelComponentReference *)local_270);
    if ((this_00 == (ON_ModelComponent *)0x0) ||
       (bVar1 = ON_Object::IsKindOf(&this_00->super_ON_Object,
                                    &ON_RenderEnvironment::m_ON_RenderEnvironment_class_rtti),
       !bVar1)) {
      iVar3 = -0x7fffffff;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_render_content.cpp"
                 ,0x711,"","Failed to add render environment; AddModelComponent() failed");
    }
    else {
      iVar3 = ON_ModelComponent::Index(this_00);
    }
    ON_ModelComponentReference::~ON_ModelComponentReference((ON_ModelComponentReference *)local_270)
    ;
    ON_wString::~ON_wString((ON_wString *)&local_278);
    ON_RenderEnvironment::~ON_RenderEnvironment((ON_RenderEnvironment *)(local_270 + 0x10));
    return iVar3;
  }
  return -0x7fffffff;
}

Assistant:

int ONX_Model::AddRenderEnvironment(const wchar_t* candidate_name)
{
  if (!ON_ModelComponent::IsValidComponentName(candidate_name))
    return ON_UNSET_INT_INDEX;

  ON_RenderEnvironment env;
  env.SetTypeId(ON_RenderContentType_BasicEnvironment);

  const ON_wString env_name = m_manifest.UnusedName(env.ComponentType(), ON_nil_uuid, candidate_name,
                                                    nullptr, nullptr, 0, nullptr);
  env.SetName(env_name);

  const ON_ModelComponentReference mcr = AddModelComponent(env, true);
  const auto* model_env = ON_RenderEnvironment::Cast(mcr.ModelComponent());
  if (nullptr == model_env)
  {
    ON_ERROR("Failed to add render environment; AddModelComponent() failed");
    return ON_UNSET_INT_INDEX;
  }

  return model_env->Index();
}